

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_stats.c
# Opt level: O2

int main(void)

{
  flexfloat_t n4;
  flexfloat_t n3;
  flexfloat_t n2;
  flexfloat_t n1;
  flexfloat_t ff_c;
  flexfloat_t ff_b;
  flexfloat_t ff_a;
  flexfloat_t local_90;
  flexfloat_t local_80;
  flexfloat_t local_70;
  flexfloat_t local_60;
  flexfloat_t local_50;
  flexfloat_t local_40;
  flexfloat_t local_30;
  
  puts(
      "WARNING: Collection of statistics is not enabled by default, execute \"cd <build_dir> && cmake -DENABLE_STATS=ON <src_dir> && make\""
      );
  ff_init_double(&local_30,10.4,(flexfloat_desc_t)0x340b);
  ff_init_double(&local_40,11.5,(flexfloat_desc_t)0x340b);
  ff_init(&local_50,(flexfloat_desc_t)0x340b);
  ff_add(&local_50,&local_30,&local_40);
  ff_add(&local_50,&local_50,&local_40);
  ff_sub(&local_50,&local_50,&local_40);
  ff_mul(&local_50,&local_50,&local_30);
  ff_init_double(&local_60,1.11,(flexfloat_desc_t)0xa05);
  ff_init_double(&local_70,3.754,(flexfloat_desc_t)0xa05);
  ff_init(&local_80,(flexfloat_desc_t)0xa05);
  ff_add(&local_80,&local_60,&local_70);
  ff_div(&local_80,&local_60,&local_70);
  ff_cast(&local_80,&local_50,(flexfloat_desc_t)0xa05);
  ff_cast(&local_90,&local_80,(flexfloat_desc_t)0x708);
  return 0;
}

Assistant:

int main(){

    double dbl;

    #ifdef FLEXFLOAT_STATS
    ff_start_stats();
    #else
    printf("WARNING: Collection of statistics is not enabled by default, execute \"cd <build_dir> && cmake -DENABLE_STATS=ON <src_dir> && make\"\n");
    #endif
    // Double-precision variables
    flexfloat_t ff_a, ff_b, ff_c;
    ff_init_double(&ff_a, 10.4, (flexfloat_desc_t) {11, 52});
    ff_init_double(&ff_b, 11.5, (flexfloat_desc_t) {11, 52});
    ff_init(&ff_c, (flexfloat_desc_t) {11, 52});

    // Arithmetic operators
    ff_add(&ff_c, &ff_a, &ff_b); // c=a+b
    ff_add(&ff_c, &ff_c, &ff_b); // c=c+b
    ff_sub(&ff_c, &ff_c, &ff_b); // c=c-b
    ff_mul(&ff_c, &ff_c, &ff_a); // c=c*b

    // IEEE float16: 5 bits (exponent) + 10 bits (explicit mantissa)
    flexfloat_t n1, n2, n3, n4;
    ff_init_double(&n1, 1.11, (flexfloat_desc_t) {5, 10});
    ff_init_double(&n2, 3.754, (flexfloat_desc_t) {5, 10});
    ff_init(&n3, (flexfloat_desc_t) {5, 10});
    ff_add(&n3, &n1, &n2);
    ff_div(&n3, &n1, &n2);

    // Casts
    ff_cast(&n3, &ff_c, (flexfloat_desc_t) {5, 10}); //  n3 = ff_c;
    ff_cast(&n4, &n3, (flexfloat_desc_t) {8, 7}); // n4 = n3

    #ifdef FLEXFLOAT_STATS
    ff_print_stats();
    #endif

    return 0;
}